

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConvertVisitor.cpp
# Opt level: O3

void __thiscall CConvertVisitor::Visit(CConvertVisitor *this,CAssignSubscriptStm *stm)

{
  string *psVar1;
  CIdExp *pCVar2;
  IExpression *pIVar3;
  
  pCVar2 = (stm->idExpression)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t
           .super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
           super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl;
  if (pCVar2 != (CIdExp *)0x0) {
    (*(code *)**(undefined8 **)&(pCVar2->super_IExpression).super_PositionedNode)(pCVar2,this);
  }
  psVar1 = &this->code;
  std::__cxx11::string::append((char *)psVar1);
  pIVar3 = (stm->indexExpression)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  if (pIVar3 != (IExpression *)0x0) {
    (*(code *)*(pIVar3->super_PositionedNode).super_INode._vptr_INode)(pIVar3,this);
  }
  std::__cxx11::string::append((char *)psVar1);
  pIVar3 = (stm->valueExpression)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  if (pIVar3 != (IExpression *)0x0) {
    (*(code *)*(pIVar3->super_PositionedNode).super_INode._vptr_INode)(pIVar3,this);
  }
  std::__cxx11::string::append((char *)psVar1);
  return;
}

Assistant:

void CConvertVisitor::Visit(CAssignSubscriptStm &stm) {
	if (stm.idExpression) {
		stm.idExpression->Accept(*this);
	}
	this->code += "[";
	if (stm.indexExpression) {
		stm.indexExpression->Accept(*this);
	}
	this->code += "] = ";
	if (stm.valueExpression) {
		stm.valueExpression->Accept(*this);
	}
	this->code += ";\n";
}